

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O0

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
duckdb::BoundCastExpression::Deserialize(Deserializer *deserializer)

{
  ClientContext *this;
  pointer ret;
  unique_ptr<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>,_true>
  *in_RSI;
  Deserializer *in_RDI;
  unique_ptr<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>,_true>
  result;
  LogicalType return_type;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> child;
  LogicalType *in_stack_ffffffffffffff48;
  pointer pBVar1;
  LogicalType *in_stack_ffffffffffffff50;
  char *tag;
  field_id_t field_id;
  char *in_stack_ffffffffffffff78;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_00;
  undefined1 local_68 [16];
  LogicalType *in_stack_ffffffffffffffa8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
  *in_stack_ffffffffffffffb0;
  ClientContext *in_stack_ffffffffffffffb8;
  BoundCastExpression *in_stack_ffffffffffffffc0;
  
  this_00._M_head_impl = (Expression *)in_RDI;
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (in_RDI,(field_id_t)((ulong)in_RDI >> 0x30),in_stack_ffffffffffffff78);
  Deserializer::ReadProperty<duckdb::LogicalType>
            ((Deserializer *)this_00._M_head_impl,(field_id_t)((ulong)in_RDI >> 0x30),
             in_stack_ffffffffffffff78);
  operator_new(0x80);
  this = Deserializer::Get<duckdb::ClientContext&>((Deserializer *)0xacf83b);
  tag = &stack0xffffffffffffffb0;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_ffffffffffffff50,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_ffffffffffffff48);
  field_id = (field_id_t)((ulong)local_68 >> 0x30);
  LogicalType::LogicalType(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  BoundCastExpression(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                      in_stack_ffffffffffffffa8);
  pBVar1 = (pointer)&stack0xffffffffffffffb8;
  unique_ptr<duckdb::BoundCastExpression,std::default_delete<duckdb::BoundCastExpression>,true>::
  unique_ptr<std::default_delete<duckdb::BoundCastExpression>,void>
            ((unique_ptr<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>,_true>
              *)in_stack_ffffffffffffff50,pBVar1);
  LogicalType::~LogicalType((LogicalType *)0xacf8ad);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0xacf8b7);
  ret = unique_ptr<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>,_true>
        ::operator->(in_RSI);
  Deserializer::ReadPropertyWithDefault<bool>((Deserializer *)this,field_id,tag,(bool *)ret);
  unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
  unique_ptr<duckdb::BoundCastExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)in_RSI
             ,(unique_ptr<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>_>
               *)pBVar1);
  unique_ptr<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>,_true>::
  ~unique_ptr((unique_ptr<duckdb::BoundCastExpression,_std::default_delete<duckdb::BoundCastExpression>,_true>
               *)0xacf90e);
  LogicalType::~LogicalType((LogicalType *)0xacf91b);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0xacf928);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         this_00._M_head_impl;
}

Assistant:

unique_ptr<Expression> BoundCastExpression::Deserialize(Deserializer &deserializer) {
	auto child = deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(200, "child");
	auto return_type = deserializer.ReadProperty<LogicalType>(201, "return_type");
	auto result = duckdb::unique_ptr<BoundCastExpression>(new BoundCastExpression(deserializer.Get<ClientContext &>(), std::move(child), std::move(return_type)));
	deserializer.ReadPropertyWithDefault<bool>(202, "try_cast", result->try_cast);
	return std::move(result);
}